

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O0

CloudMediumProvider *
pbrt::CloudMediumProvider::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  CloudMediumProvider *pCVar3;
  Point3<float> *in_RDI;
  Float FVar4;
  ParameterDictionary *this;
  float *args_1;
  Tuple3<pbrt::Point3,_float> TVar5;
  Tuple3<pbrt::Point3,_float> TVar6;
  Point3f p1;
  Point3f p0;
  Float extent;
  Float wispiness;
  Float density;
  float in_stack_fffffffffffffdf8;
  float in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  Bounds3<float> *in_stack_fffffffffffffe18;
  Point3<float> *p1_00;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  string *in_stack_fffffffffffffe38;
  ParameterDictionary *in_stack_fffffffffffffe40;
  undefined1 local_121 [37];
  undefined8 local_fc;
  float local_f4;
  undefined8 local_f0;
  float local_e8;
  allocator<char> local_d1;
  string local_d0 [32];
  undefined8 local_b0;
  float local_a8;
  allocator<char> local_a1;
  string local_a0 [32];
  Float local_80;
  allocator<char> local_79;
  string local_78 [32];
  Float local_58;
  allocator<char> local_41;
  string local_40 [36];
  Float local_1c;
  Point3<float> *local_10;
  
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  FVar4 = ParameterDictionary::GetOneFloat
                    ((ParameterDictionary *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (string *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0.0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  local_1c = FVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  FVar4 = ParameterDictionary::GetOneFloat
                    ((ParameterDictionary *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (string *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0.0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  local_58 = FVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  FVar4 = ParameterDictionary::GetOneFloat
                    ((ParameterDictionary *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (string *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0.0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  local_80 = FVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  this = (ParameterDictionary *)0x0;
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8,0.0);
  TVar5 = (Tuple3<pbrt::Point3,_float>)
          ParameterDictionary::GetOnePoint3f
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                     (Point3f *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  local_e8 = TVar5.z;
  auVar2._8_8_ = this;
  auVar2._0_8_ = TVar5._0_8_;
  local_f0 = vmovlpd_avx(auVar2);
  local_b0 = local_f0;
  local_a8 = local_e8;
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  p1_00 = (Point3<float> *)local_121;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,TVar5._0_8_,
             (allocator<char> *)CONCAT44(TVar5.z,in_stack_fffffffffffffe30));
  args_1 = (float *)0x0;
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8,0.0);
  TVar6 = (Tuple3<pbrt::Point3,_float>)
          ParameterDictionary::GetOnePoint3f
                    (this,TVar5._0_8_,(Point3f *)CONCAT44(TVar5.z,in_stack_fffffffffffffe30));
  local_f4 = TVar6.z;
  auVar1._8_8_ = args_1;
  auVar1._0_8_ = TVar6._0_8_;
  local_fc = vmovlpd_avx(auVar1);
  std::__cxx11::string::~string((string *)(local_121 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_121);
  Bounds3<float>::Bounds3
            ((Bounds3<float> *)CONCAT44(TVar5.z,in_stack_fffffffffffffe30),p1_00,local_10);
  pCVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::CloudMediumProvider,pbrt::Bounds3<float>,float&,float&,float&>
                     ((polymorphic_allocator<std::byte> *)local_10,in_stack_fffffffffffffe18,args_1,
                      TVar6._0_8_,(float *)CONCAT44(TVar6.z,in_stack_fffffffffffffe00));
  return pCVar3;
}

Assistant:

CloudMediumProvider *CloudMediumProvider::Create(const ParameterDictionary &parameters,
                                                 const FileLoc *loc, Allocator alloc) {
    Float density = parameters.GetOneFloat("density", 1);
    Float wispiness = parameters.GetOneFloat("wispiness", 1);
    Float extent = parameters.GetOneFloat("extent", 1);

    Point3f p0 = parameters.GetOnePoint3f("p0", Point3f(0.f, 0.f, 0.f));
    Point3f p1 = parameters.GetOnePoint3f("p1", Point3f(1.f, 1.f, 1.f));

    return alloc.new_object<CloudMediumProvider>(Bounds3f(p0, p1), density, wispiness,
                                                 extent);
}